

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_spatial_split
          (HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,SpatialSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  size_t begin;
  size_t end;
  long lVar1;
  size_t sVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  anon_class_1_0_00000001 local_11b;
  anon_class_1_0_00000001 local_11a;
  EmptyTy local_119;
  vbool4 vSplitMask;
  vint4 vSplitPos;
  anon_class_24_3_36a9e8c5 isLeft;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  unsigned_long uStack_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  unsigned_long uStack_40;
  
  begin = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  end = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_88._0_8_ = 0x7f8000007f800000;
  local_88._8_8_ = 0x7f8000007f800000;
  local_78 = 0xff800000ff800000;
  uStack_70 = 0xff800000ff800000;
  local_68 = 0x7f8000007f800000;
  uStack_60 = 0x7f8000007f800000;
  local_58 = 0xff800000ff800000;
  uStack_50 = 0xff800000ff800000;
  local_48 = 0;
  uStack_40 = 0;
  local_d8._0_8_ = 0x7f8000007f800000;
  local_d8._8_8_ = 0x7f8000007f800000;
  local_c8 = 0xff800000ff800000;
  uStack_c0 = 0xff800000ff800000;
  local_b8 = 0x7f8000007f800000;
  uStack_b0 = 0x7f8000007f800000;
  local_a8 = 0xff800000ff800000;
  uStack_a0 = 0xff800000ff800000;
  local_98 = 0;
  uStack_90 = 0;
  vSplitPos.field_0.i[0] = split->pos;
  isLeft.mapping = &split->mapping;
  isLeft.vSplitPos = &vSplitPos;
  lVar1 = (long)(1 << ((byte)split->dim & 0x1f)) * 0x10;
  vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar1);
  vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar1 + 8);
  isLeft.vSplitMask = &vSplitMask;
  vSplitPos.field_0.i[1] = vSplitPos.field_0.i[0];
  vSplitPos.field_0.i[2] = vSplitPos.field_0.i[0];
  vSplitPos.field_0.i[3] = vSplitPos.field_0.i[0];
  sVar2 = parallel_partitioning<embree::PrimRef,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_split(embree::sse2::SpatialBinSplit<16ul>const&,embree::sse2::PrimInfoExtRange_const&,embree::sse2::PrimInfoExtRange&,embree::sse2::PrimInfoExtRange&)::_lambda(embree::PrimRef_const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_split(embree::sse2::SpatialBinSplit<16ul>const&,embree::sse2::PrimInfoExtRange_const&,embree::sse2::PrimInfoExtRange&,embree::sse2::PrimInfoExtRange&)::_lambda(embree::PrimInfoT<embree::BBox<embree::Vec3fa>>&,embree::PrimRef_const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_split(embree::sse2::SpatialBinSplit<16ul>const&,embree::sse2::PrimInfoExtRange_const&,embree::sse2::PrimInfoExtRange&,embree::sse2::PrimInfoExtRange&)::_lambda(embree::PrimInfoT<embree::BBox<embree::Vec3fa>>&,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>const&)_1_>
                    (this->prims0,begin,end,&local_119,
                     (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_88.field_1,
                     (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_d8.field_1,&isLeft,
                     &local_11a,&local_11b,0x80);
  *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_88._0_8_;
  *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
       local_88._8_8_;
  *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_78;
  *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) = uStack_70;
  *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_68;
  *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) = uStack_60;
  *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_58;
  *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) = uStack_50;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = begin;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = sVar2;
  (lset->super_extended_range<unsigned_long>)._ext_end = sVar2;
  *(undefined8 *)&(rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_d8._0_8_;
  *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
       local_d8._8_8_;
  *(undefined8 *)&(rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_c8;
  *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) = uStack_c0;
  *(undefined8 *)&(rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_b8;
  *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) = uStack_b0;
  *(undefined8 *)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_a8;
  *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) = uStack_a0;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = sVar2;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = end;
  (rset->super_extended_range<unsigned_long>)._ext_end = end;
  pVar3.second = uStack_90;
  pVar3.first = uStack_40;
  return pVar3;
}

Assistant:

__noinline std::pair<size_t,size_t> parallel_spatial_split(const SpatialSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset)
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo left(empty);
          PrimInfo right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim;

          /* init spatial mapping */
          const SpatialBinMapping<SPATIAL_BINS>& mapping = split.mapping;
          const vint4 vSplitPos(splitPos);
          const vbool4 vSplitMask( (int)splitDimMask );

          auto isLeft = [&] (const PrimRef &ref) { 
            const Vec3fa c = ref.bounds().center();
            return any(((vint4)mapping.bin(c) < vSplitPos) & vSplitMask); };

          const size_t center = parallel_partitioning(
            prims0,begin,end,EmptyTy(),left,right,isLeft,
            [] (PrimInfo &pinfo,const PrimRef &ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); },
            [] (PrimInfo &pinfo0,const PrimInfo &pinfo1) { pinfo0.merge(pinfo1); },
            PARALLEL_PARTITION_BLOCK_SIZE);

          const size_t left_weight  = left.end;
          const size_t right_weight = right.end;
          
          left.begin  = begin;  left.end  = center; 
          right.begin = center; right.end = end;
          
          new (&lset) PrimInfoExtRange(begin,center,center,left);
          new (&rset) PrimInfoExtRange(center,end,end,right);

          assert(area(left.geomBounds) >= 0.0f);
          assert(area(right.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }